

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilnam.cpp
# Opt level: O0

int __thiscall
CVmObjFileName::getp_getFileType(CVmObjFileName *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  int iVar1;
  vm_obj_id_t vVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  vm_val_t *pvVar6;
  undefined8 *puVar7;
  long *plVar8;
  int *in_RCX;
  vm_val_t *in_RDX;
  undefined8 in_RDI;
  err_frame_t err_cur__;
  unsigned_long osattr;
  unsigned_long osmode;
  int ok;
  int follow_links;
  CVmNetFile *netfile;
  vm_rcdesc rc;
  uint argc;
  undefined4 in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe4c;
  CVmNetFile *in_stack_fffffffffffffe50;
  vm_val_t *in_stack_fffffffffffffe58;
  void *pvVar9;
  vm_rcdesc *in_stack_fffffffffffffe60;
  CVmObjFileName *this_00;
  vm_obj_id_t obj;
  uint local_188 [2];
  CVmObjFileName *local_180;
  void *local_178;
  __jmp_buf_tag _Stack_170;
  int local_a0;
  int local_98;
  uint local_94;
  CVmNetFile *local_90;
  int local_2c;
  vm_val_t *local_20;
  
  obj = (vm_obj_id_t)((ulong)in_RDI >> 0x20);
  if (in_RCX == (int *)0x0) {
    iVar3 = 0;
  }
  else {
    iVar3 = *in_RCX;
  }
  local_2c = iVar3;
  local_20 = in_RDX;
  if ((getp_getFileType(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_getFileType(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_getFileType::desc,0);
    __cxa_guard_release(&getp_getFileType(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    (in_stack_fffffffffffffe58,(uint *)in_stack_fffffffffffffe50,
                     (CVmNativeCodeDesc *)
                     CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  if (iVar1 == 0) {
    vVar2 = CVmMetaclass::get_class_obj((CVmMetaclass *)in_stack_fffffffffffffe60);
    CVmStack::get(0);
    vm_rcdesc::vm_rcdesc
              (in_stack_fffffffffffffe60,(char *)in_stack_fffffffffffffe58,
               (vm_obj_id_t)((ulong)in_stack_fffffffffffffe50 >> 0x20),
               (unsigned_short)((ulong)in_stack_fffffffffffffe50 >> 0x10),
               (vm_val_t *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),0);
    local_90 = CVmObjFile::get_filename_from_obj
                         (obj,(vm_rcdesc *)CONCAT44(iVar3,vVar2),
                          (int)((ulong)in_stack_fffffffffffffe60 >> 0x20),
                          (os_filetype_t)in_stack_fffffffffffffe60,(char *)in_stack_fffffffffffffe58
                         );
    local_94 = 1;
    if (local_2c != 0) {
      pvVar6 = CVmStack::get(0);
      iVar3 = vm_val_t::get_logical(pvVar6);
      local_94 = (uint)((iVar3 != 0 ^ 0xffU) & 1);
      pvVar6 = CVmStack::get(0);
      iVar3 = vm_val_t::is_logical(pvVar6);
      if (iVar3 == 0) {
        err_throw(0);
      }
    }
    puVar7 = (undefined8 *)_ZTW11G_err_frame();
    local_180 = (CVmObjFileName *)*puVar7;
    plVar8 = (long *)_ZTW11G_err_frame();
    *plVar8 = (long)local_188;
    local_188[0] = _setjmp(&_Stack_170);
    if (local_188[0] == 0) {
      local_98 = CVmNetFile::get_file_mode
                           ((CVmNetFile *)in_stack_fffffffffffffe60,
                            (unsigned_long *)in_stack_fffffffffffffe58,
                            (unsigned_long *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
    }
    if ((local_188[0] & 0x8000) == 0) {
      local_188[0] = local_188[0] | 0x8000;
      CVmNetFile::abandon(in_stack_fffffffffffffe50);
    }
    this_00 = local_180;
    puVar7 = (undefined8 *)_ZTW11G_err_frame();
    *puVar7 = this_00;
    if ((local_188[0] & 0x4001) != 0) {
      puVar7 = (undefined8 *)_ZTW11G_err_frame();
      if ((*(uint *)*puVar7 & 2) != 0) {
        plVar8 = (long *)_ZTW11G_err_frame();
        free(*(void **)(*plVar8 + 0x10));
      }
      pvVar9 = local_178;
      plVar8 = (long *)_ZTW11G_err_frame();
      *(void **)(*plVar8 + 0x10) = pvVar9;
      err_rethrow();
    }
    if ((local_188[0] & 2) != 0) {
      free(local_178);
    }
    if (local_98 == 0) {
      vm_val_t::set_nil(local_20);
    }
    else {
      uVar4 = filemode_to_filetype(local_a0);
      uVar5 = special_filetype_flags(this_00);
      vm_val_t::set_int(local_20,uVar4 | uVar5);
    }
    CVmStack::discard(local_2c);
  }
  return 1;
}

Assistant:

int CVmObjFileName::getp_getFileType(VMG_ vm_obj_id_t self,
                                     vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* get the filename; use the GETINFO access mode */
    vm_rcdesc rc(vmg_ "FileName.getFileType",
                 metaclass_reg_->get_class_obj(vmg0_),
                 VMOFN_GETFILETYPE, G_stk->get(0), argc);
    CVmNetFile *netfile = CVmObjFile::get_filename_from_obj(
        vmg_ self, &rc, VMOBJFILE_ACCESS_GETINFO,
        OSFTUNK, "application/octet-stream");

    /* check to see if we're following links (follow them by default) */
    int follow_links = TRUE;
    if (argc >= 1)
    {
        /* 
         *   note that our 'asLink' parameter has the opposite sense from
         *   'follow_links', so invert the parameter value 
         */
        follow_links = !G_stk->get(0)->get_logical();
        if (!G_stk->get(0)->is_logical())
            err_throw(VMERR_BAD_VAL_BIF);
    }

    int ok;
    unsigned long osmode, osattr;
    err_try
    {
        /* get the file type from the netfile object */
        ok = netfile->get_file_mode(vmg_ &osmode, &osattr, follow_links);
    }